

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = p->pObjs;
  if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) {
LAB_00233bb4:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar2] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iVar2] = p->nTravIds;
  uVar3 = (uint)*(undefined8 *)pObj;
  iVar4 = 1;
  if ((~uVar3 & 0x9fffffff) == 0) {
    return 1;
  }
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x1d4,"int Gia_ManLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (pGVar5 + p->nObjs <= pObj) goto LAB_00233bb4;
  piVar1 = p->pSibls;
  if ((piVar1 == (int *)0x0) || (piVar1[iVar2] == 0)) goto LAB_00233b62;
  if (piVar1 == (int *)0x0) {
LAB_00233b58:
    pGVar5 = (Gia_Obj_t *)0x0;
  }
  else {
    uVar3 = piVar1[iVar2];
    if ((ulong)uVar3 == 0) goto LAB_00233b58;
    if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = pGVar5 + uVar3;
  }
  Gia_ManLevelWithBoxes_rec(p,pGVar5);
LAB_00233b62:
  iVar2 = Gia_ManLevelWithBoxes_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
  if ((iVar2 == 0) &&
     (iVar2 = Gia_ManLevelWithBoxes_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff)),
     iVar2 == 0)) {
    Gia_ObjSetAndLevel(p,pObj);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Gia_ManLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) );
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin1(pObj) ) )
        return 1;
    Gia_ObjSetAndLevel( p, pObj );
    return 0;
}